

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.hpp
# Opt level: O0

type setMDPenum<GMXMDP::PullType>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType>_>_>
                *str2enum,string *str,PullType *optval)

{
  bool bVar1;
  MDP_Exception *this;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  PullType *optval_local;
  string *str_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType>_>_>
  *str2enum_local;
  
  it._M_node = (_Base_ptr)optval;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType>_>_>
       ::find(str2enum,str);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType>_>_>
       ::end(str2enum);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GMXMDP::PullType>_>
             ::operator->(&local_28);
    (it._M_node)->_M_color = ppVar2->second;
    return;
  }
  this = (MDP_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_70,"Can\'t find enum for string: \'",str);
  std::operator+(&local_50,&local_70,"\'");
  MDP_Exception::MDP_Exception(this,&local_50);
  __cxa_throw(this,&MDP_Exception::typeinfo,MDP_Exception::~MDP_Exception);
}

Assistant:

typename enable_if<std::is_enum<T>::value, void>::type
setMDPenum(const map<string, T>& str2enum, const string& str, T& optval) {
  const typename map<string,T>::const_iterator it = str2enum.find(str);
  if(it == str2enum.end()) {
    throw(MDP_Exception("Can't find enum for string: '"+str+"'"));
  }
  optval = it->second;
}